

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::RunContext::assertionPassed(RunContext *this)

{
  RunContext *this_local;
  
  this->m_lastAssertionPassed = true;
  (this->m_totals).assertions.passed = (this->m_totals).assertions.passed + 1;
  resetAssertionInfo(this);
  std::vector<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>::clear
            (&this->m_messageScopes);
  return;
}

Assistant:

void RunContext::assertionPassed() {
        m_lastAssertionPassed = true;
        ++m_totals.assertions.passed;
        resetAssertionInfo();
        m_messageScopes.clear();
    }